

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O0

void __thiscall license::test::product_not_licensed::test_method(product_not_licensed *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  lazy_ostream *plVar3;
  AuditEvent *pAVar4;
  undefined4 local_1234;
  basic_cstring<const_char> local_1230;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1220;
  basic_cstring<const_char> local_11f8;
  basic_cstring<const_char> local_11e8;
  size_type local_11d8;
  undefined4 local_11cc;
  basic_cstring<const_char> local_11c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_11b8;
  basic_cstring<const_char> local_1190;
  basic_cstring<const_char> local_1180;
  basic_cstring<const_char> local_1170;
  basic_cstring<const_char> local_1160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1150;
  assertion_result local_1130;
  basic_cstring<const_char> local_1118;
  basic_cstring<const_char> local_1108;
  allocator local_10f1;
  string local_10f0;
  undefined1 local_10d0 [8];
  EventRegistry registry;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  undefined1 local_1048 [8];
  LicenseLocation licLocation;
  allocator local_31;
  string local_30 [8];
  string location;
  product_not_licensed *this_local;
  
  location.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  memset(local_1048,0,0x1004);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char*>
            (__first,__last,local_1048 + 4);
  LicenseReader::LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(LicenseLocation *)local_1048);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10f0,"PRODUCT-NOT",&local_10f1);
  LicenseReader::readLicenses
            ((EventRegistry *)local_10d0,
             (LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_10f0,
             (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1118);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1108,0x31,&local_1118);
    bVar2 = EventRegistry::isGood((EventRegistry *)local_10d0);
    boost::test_tools::assertion_result::assertion_result(&local_1130,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1160,"!registry.isGood()",0x12);
    boost::unit_test::operator<<(&local_1150,plVar3,&local_1160);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_1130,&local_1150,&local_1170,0x31,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1150);
    boost::test_tools::assertion_result::~assertion_result(&local_1130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1190);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1180,0x32,&local_1190);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_11b8,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    local_11cc = 0;
    local_11d8 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                 size((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
                      )&registry.current_validation_step);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_11b8,&local_11c8,0x32,1,2,&local_11cc,"0",&local_11d8,"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_11b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pAVar4 = EventRegistry::getLastFailure((EventRegistry *)local_10d0);
  if (pAVar4 == (AuditEvent *)0x0) {
    __assert_fail("registry.getLastFailure() != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
                  ,0x33,"void license::test::product_not_licensed::test_method()");
  }
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_11e8,0x34,&local_11f8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1220,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    local_1234 = 6;
    pAVar4 = EventRegistry::getLastFailure((EventRegistry *)local_10d0);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,LCC_EVENT_TYPE,LCC_EVENT_TYPE>
              (&local_1220,&local_1230,0x34,1,2,&local_1234,"PRODUCT_NOT_LICENSED",
               &pAVar4->event_type,"registry.getLastFailure()->event_type");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  EventRegistry::~EventRegistry((EventRegistry *)local_10d0);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  LicenseReader::~LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(product_not_licensed) {
	string location = PROJECT_TEST_SRC_DIR "/library/test_reader.ini";
	LicenseLocation licLocation = {LICENSE_PATH};
	std::copy(location.begin(), location.end(), licLocation.licenseData);
	LicenseReader licenseReader(&licLocation);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT-NOT", licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_EQUAL(PRODUCT_NOT_LICENSED, registry.getLastFailure()->event_type);
}